

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O3

ostream * pstack::operator<<(ostream *os,JSON<pstack::Field<char[5],_pstack::Dwarf::Form>,_char> *o)

{
  ostream *poVar1;
  JSON<const_char_*,_char> local_40;
  char (*local_30) [5];
  char local_21;
  
  local_30 = o->object->k;
  local_40.context = &local_21;
  local_21 = '\0';
  local_40.object = (char **)&local_30;
  poVar1 = operator<<(os,&local_40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
  local_40.context = o->context;
  local_40.object = (char **)o->object->v;
  poVar1 = operator<<(poVar1,(JSON<pstack::Dwarf::Form,_char> *)&local_40);
  return poVar1;
}

Assistant:

std::ostream &
operator << (std::ostream &os, const JSON<Field<K,V>, C> &o)
{
   return os << json(o.object.k) << ":" << json(o.object.v, o.context);
}